

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O1

bool __thiscall optimization::memvar_propagation::Dest::operator==(Dest *this,Dest *d)

{
  char cVar1;
  int iVar2;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar3;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar4;
  variant_alternative_t<0UL,_variant<int,_VarId>_> *pvVar5;
  undefined1 *__v;
  
  if ((this->dest).id != (d->dest).id) {
    return false;
  }
  __v = &(this->offset).field_0x8;
  cVar1 = (d->offset).field_0x18;
  if ((this->offset).field_0x18 == '\0') {
    if (cVar1 == '\0') {
      pvVar5 = std::get<0ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)__v);
      iVar2 = *pvVar5;
      pvVar5 = std::get<0ul,int,mir::inst::VarId>
                         ((variant<int,_mir::inst::VarId> *)&(d->offset).field_0x8);
      return iVar2 == *pvVar5;
    }
  }
  else if (cVar1 == '\x01') {
    pvVar3 = std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)__v);
    pvVar4 = std::get<1ul,int,mir::inst::VarId>
                       ((variant<int,_mir::inst::VarId> *)&(d->offset).field_0x8);
    return pvVar3->id == pvVar4->id;
  }
  return false;
}

Assistant:

bool operator<(const VarId& other) const { return id < other.id; }